

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct(IfcProduct *this)

{
  *(undefined ***)&this->field_0x100 = &PTR__Object_007fca00;
  *(undefined8 *)&this->field_0x108 = 0;
  *(char **)&this->field_0x110 = "IfcProduct";
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__00805ad0);
  *(undefined8 *)&(this->super_IfcObject).field_0xd8 = 0;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0;
  *(undefined8 *)&this->super_IfcObject = 0x805a18;
  *(undefined8 *)&this->field_0x100 = 0x805ab8;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x805a40;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x805a68;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0x805a90;
  this->field_0xe8 = 0;
  (this->Representation).ptr.obj = (LazyObject *)0x0;
  (this->Representation).have = false;
  return;
}

Assistant:

IfcProduct() : Object("IfcProduct") {}